

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

void booster::aio::details::add<booster::aio::const_buffer>(const_buffer *left,const_buffer *right)

{
  uint uVar1;
  ulong uVar2;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar3;
  
  pVar3 = buffer_impl<const_char_*>::get(&right->super_buffer_impl<const_char_*>);
  for (uVar1 = 0; uVar2 = (ulong)uVar1, uVar2 < pVar3.second; uVar1 = uVar1 + 1) {
    buffer_impl<const_char_*>::add
              (&left->super_buffer_impl<const_char_*>,pVar3.first[uVar2].ptr,pVar3.first[uVar2].size
              );
  }
  return;
}

Assistant:

void add(Buffer &left,Buffer const &right)
			{
				typename Buffer::buffer_data_type data=right.get();
				for(unsigned i=0;i<data.second;i++)
					left.add(data.first[i].ptr,data.first[i].size);
			}